

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O1

void __thiscall
Diffusion::Diffusion
          (Diffusion *this,Amr *Parent,NavierStokesBase *Caller,Diffusion *Coarser,int num_state,
          FluxRegister *Viscflux_reg,Vector<int,_std::allocator<int>_> *_is_diffusive)

{
  int iVar1;
  pointer piVar2;
  Diffusion *pDVar3;
  pointer pIVar4;
  pointer piVar5;
  long lVar6;
  ParmParse pp;
  ParmParse ppdiff;
  string local_e0;
  undefined1 local_c0 [88];
  ParmParse local_68;
  
  this->parent = Parent;
  this->navier_stokes = Caller;
  this->grids = &(Caller->super_AmrLevel).grids;
  this->dmap = &(Caller->super_AmrLevel).dmap;
  this->level = (Caller->super_AmrLevel).level;
  this->coarser = Coarser;
  this->finer = (Diffusion *)0x0;
  this->NUM_STATE = num_state;
  (this->crse_ratio).vect[0] = 0;
  (this->crse_ratio).vect[1] = 0;
  (this->crse_ratio).vect[2] = 0;
  this->viscflux_reg = Viscflux_reg;
  if ((anonymous_namespace)::initialized == '\0') {
    verbose = 0;
    visc_tol = 1e-10;
    do_reflux = 1;
    scale_abec = 0;
    max_order = 2;
    tensor_max_order = 2;
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"diffuse","");
    amrex::ParmParse::ParmParse(&local_68,(string *)local_c0);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    amrex::ParmParse::query(&local_68,"v",&verbose,0);
    amrex::ParmParse::query(&local_68,"scale_abec",&scale_abec,0);
    amrex::ParmParse::query(&local_68,"max_order",&max_order,0);
    amrex::ParmParse::query(&local_68,"tensor_max_order",&tensor_max_order,0);
    amrex::ParmParse::query(&local_68,"agglomeration",&(anonymous_namespace)::agglomeration,0);
    amrex::ParmParse::query(&local_68,"consolidation",&(anonymous_namespace)::consolidation,0);
    amrex::ParmParse::query(&local_68,"max_fmg_iter",&(anonymous_namespace)::max_fmg_iter,0);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ns","");
    amrex::ParmParse::ParmParse((ParmParse *)local_c0,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    amrex::ParmParse::query((ParmParse *)local_c0,"visc_tol",&visc_tol,0);
    amrex::ParmParse::query((ParmParse *)local_c0,"do_reflux",&do_reflux,0);
    do_reflux = (int)(do_reflux != 0);
    if ((int)((ulong)((long)(_is_diffusive->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(_is_diffusive->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) < this->NUM_STATE) {
      amrex::Abort_host("Diffusion::Diffusion(): is_diffusive array is not long enough");
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&is_diffusive.super_vector<int,_std::allocator<int>_>,(long)this->NUM_STATE);
    piVar5 = is_diffusive.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (0 < this->NUM_STATE) {
      piVar2 = (_is_diffusive->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar6 = 0;
      do {
        piVar5[lVar6] = piVar2[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->NUM_STATE);
    }
    echo_settings(this);
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x37a06c);
    (anonymous_namespace)::initialized = '\x01';
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c0);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  }
  lVar6 = (long)this->level;
  if (0 < lVar6) {
    pDVar3 = this->coarser;
    pIVar4 = (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = *(int *)((long)(pIVar4 + lVar6 + 0xffffffffffffffff) + 8);
    *(undefined8 *)(this->crse_ratio).vect = *(undefined8 *)pIVar4[lVar6 + 0xffffffffffffffff].vect;
    (this->crse_ratio).vect[2] = iVar1;
    pDVar3->finer = this;
  }
  return;
}

Assistant:

Diffusion::Diffusion (Amr*               Parent,
                      NavierStokesBase*  Caller,
                      Diffusion*         Coarser,
                      int                num_state,
                      FluxRegister*      Viscflux_reg,
                      const Vector<int>&  _is_diffusive)
    :
    parent(Parent),
    navier_stokes(Caller),
    grids(navier_stokes->boxArray()),
    dmap(navier_stokes->DistributionMap()),
    level(navier_stokes->Level()),
    coarser(Coarser),
    finer(0),
    NUM_STATE(num_state),
    viscflux_reg(Viscflux_reg)

{
    if (!initialized)
    {
        //
        // Set defaults here!!!
        //
        Diffusion::verbose             = 0;
        Diffusion::visc_tol            = 1.0e-10;
        Diffusion::do_reflux           = 1;
        Diffusion::scale_abec          = 0;
        //
        // It is essential that we set max_order of the solver to 2
        // if we want to use the standard sol(i)-sol(i-1) approximation
        // for the gradient at Dirichlet boundaries.
        // The solver's default order is 3 and this uses three points for the
        // gradient at a Dirichlet boundary.
        //
        Diffusion::max_order           = 2;
        Diffusion::tensor_max_order    = 2;

        ParmParse ppdiff("diffuse");

        ppdiff.query("v",                   verbose);
        ppdiff.query("scale_abec",          scale_abec);
        ppdiff.query("max_order",           max_order);
        ppdiff.query("tensor_max_order",    tensor_max_order);

        ppdiff.query("agglomeration", agglomeration);
        ppdiff.query("consolidation", consolidation);
        ppdiff.query("max_fmg_iter", max_fmg_iter);
#ifdef AMREX_USE_HYPRE
        ppdiff.query("use_hypre", use_hypre);
        ppdiff.query("hypre_verbose", hypre_verbose);
#endif

        ParmParse pp("ns");

        pp.query("visc_tol",  visc_tol);
        pp.query("do_reflux", do_reflux);

        do_reflux = (do_reflux ? 1 : 0);

        const int n_diff = _is_diffusive.size();

        if (n_diff < NUM_STATE)
            amrex::Abort("Diffusion::Diffusion(): is_diffusive array is not long enough");

        is_diffusive.resize(NUM_STATE);

        for (int i = 0; i < NUM_STATE; i++)
        {
            is_diffusive[i] = _is_diffusive[i];
        }

        echo_settings();

        amrex::ExecOnFinalize(Diffusion::Finalize);

        initialized = true;
    }

    if (level > 0)
    {
        crse_ratio = parent->refRatio(level-1);
        coarser->finer = this;
    }
}